

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O3

GLuint gl4cts::KHRDebug::LabelsTest::createTransformFeedback(Functions *gl,RenderContext *rc)

{
  bool bVar1;
  uint in_EAX;
  ContextType ctxType;
  GLenum err;
  int line;
  char *msg;
  GLuint id;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  ctxType.super_ApiType.m_bits = (ApiType)(*rc->_vptr_RenderContext[2])(rc);
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  if (bVar1) {
    (*gl->createTransformFeedbacks)(1,(GLuint *)((long)&uStack_18 + 4));
    err = (*gl->getError)();
    msg = "CreateTransformFeedbacks";
    line = 0x441;
  }
  else {
    (*gl->genTransformFeedbacks)(1,(GLuint *)((long)&uStack_18 + 4));
    (*gl->bindTransformFeedback)(0x8e22,uStack_18._4_4_);
    (*gl->bindTransformFeedback)(0x8e22,0);
    err = (*gl->getError)();
    msg = "GenTransformFeedbacks / BindTransformFeedback";
    line = 0x448;
  }
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,line);
  return uStack_18._4_4_;
}

Assistant:

GLuint LabelsTest::createTransformFeedback(const Functions* gl, const glu::RenderContext* rc)
{
	GLuint id = 0;
	if (glu::contextSupports(rc->getType(), glu::ApiType::core(4, 5)))
	{
		gl->createTransformFeedbacks(1, &id);
		GLU_EXPECT_NO_ERROR(gl->getError(), "CreateTransformFeedbacks");
	}
	else
	{
		gl->genTransformFeedbacks(1, &id);
		gl->bindTransformFeedback(GL_TRANSFORM_FEEDBACK, id);
		gl->bindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
		GLU_EXPECT_NO_ERROR(gl->getError(), "GenTransformFeedbacks / BindTransformFeedback");
	}

	return id;
}